

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O0

void __thiscall covenant::CFG::check_well_formed(CFG *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ostream *poVar4;
  ulong uVar5;
  reference pvVar6;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *__x;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> *pvVar7;
  reference pvVar8;
  reference pvVar9;
  void *this_00;
  CFG *this_01;
  long in_RDI;
  uint k;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int r;
  uint ri;
  uint vv_1;
  uint vv;
  ostringstream error_msg;
  bool error;
  CFG *in_stack_fffffffffffffcf8;
  ostream *in_stack_fffffffffffffd00;
  ostream *in_stack_fffffffffffffd10;
  CFG *in_stack_fffffffffffffd18;
  CFG *in_stack_fffffffffffffd20;
  byte local_2b9;
  undefined7 in_stack_fffffffffffffd50;
  byte bVar10;
  byte local_299;
  string local_268 [160];
  uint local_1c8;
  undefined4 local_1c4;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_1c0;
  int local_1a8;
  uint local_1a4;
  uint local_1a0;
  int local_19c;
  uint local_198;
  ostringstream local_188 [383];
  byte local_9;
  
  local_9 = 0;
  std::__cxx11::ostringstream::ostringstream(local_188);
  sVar3 = std::
          vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
          ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                  *)(in_RDI + 0x40));
  if (sVar3 == 0) {
    local_9 = 1;
    poVar4 = std::operator<<((ostream *)local_188,
                             "ERROR: grammar must have at least one production rule.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  for (local_198 = 0; uVar5 = (ulong)local_198,
      sVar3 = std::
              vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
              ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                      *)(in_RDI + 0x40)), uVar5 < sVar3; local_198 = local_198 + 1) {
    pvVar6 = std::
             vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
             ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                           *)(in_RDI + 0x40),(ulong)local_198);
    sVar3 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                      (pvVar6);
    if (sVar3 == 0) {
      local_9 = 1;
      std::operator<<((ostream *)local_188,"ERROR: ");
      local_19c = (int)Sym::mkVar(local_198);
      poVar4 = covenant::operator<<
                         ((ostream *)in_stack_fffffffffffffcf8,
                          (Sym)(int)((ulong)in_stack_fffffffffffffd00 >> 0x20));
      std::operator<<(poVar4," non-terminal symbol without rule.\n");
      std::operator<<((ostream *)local_188,
                      "Also possible a terminal misinterpreted as nonterminal.\n");
    }
  }
  local_1a0 = 0;
  do {
    uVar5 = (ulong)local_1a0;
    sVar3 = std::
            vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
            ::size((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                    *)(in_RDI + 0x40));
    local_299 = 0;
    if (uVar5 < sVar3) {
      local_299 = local_9 ^ 0xff;
    }
    if ((local_299 & 1) == 0) {
      if ((local_9 & 1) != 0) {
        CFG(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        this_01 = (CFG *)covenant::operator<<(in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        poVar4 = (ostream *)std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>)
        ;
        std::__cxx11::ostringstream::str();
        std::operator<<(poVar4,local_268);
        std::__cxx11::string::~string(local_268);
        ~CFG(this_01);
        exit(1);
      }
      std::__cxx11::ostringstream::~ostringstream(local_188);
      return;
    }
    local_1a4 = 0;
    while( true ) {
      __x = (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)(ulong)local_1a4;
      pvVar6 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RDI + 0x40),(ulong)local_1a0);
      pvVar7 = (vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
               std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::size
                         (pvVar6);
      bVar10 = 0;
      if (__x < pvVar7) {
        bVar10 = local_9 ^ 0xff;
      }
      if ((bVar10 & 1) == 0) break;
      pvVar6 = std::
               vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ::operator[]((vector<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                             *)(in_RDI + 0x40),(ulong)local_1a0);
      pvVar8 = std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>::
               operator[](pvVar6,(ulong)local_1a4);
      local_1a8 = pvVar8->rule;
      std::
      vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
      ::operator[]((vector<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                    *)(in_RDI + 0x58),(long)local_1a8);
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)
                 CONCAT17(bVar10,in_stack_fffffffffffffd50),__x);
      sVar3 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_1c0);
      if (sVar3 == 0) {
        local_1c4 = 10;
      }
      else {
        local_1c8 = 0;
        while( true ) {
          uVar5 = (ulong)local_1c8;
          sVar3 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::size(&local_1c0);
          local_2b9 = 0;
          if (uVar5 < sVar3) {
            local_2b9 = local_9 ^ 0xff;
          }
          if ((local_2b9 & 1) == 0) break;
          std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                    (&local_1c0,(ulong)local_1c8);
          bVar1 = Sym::isTerm((Sym *)0x1ca21a);
          if (bVar1) {
            pvVar9 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                               (&local_1c0,(ulong)local_1c8);
            iVar2 = Sym::symID(pvVar9);
            if (*(int *)(in_RDI + 0x34) <= iVar2) {
              pvVar9 = std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::operator[]
                                 (&local_1c0,(ulong)local_1c8);
              iVar2 = Sym::symID(pvVar9);
              if (iVar2 < *(int *)(in_RDI + 0x34) + *(int *)(in_RDI + 0x30)) goto LAB_001ca369;
            }
            local_9 = 1;
            std::operator<<((ostream *)local_188,"ERROR: some terminal symbol is out of range. ");
            in_stack_fffffffffffffd20 =
                 (CFG *)std::operator<<((ostream *)local_188,"It must be between ");
            in_stack_fffffffffffffd18 =
                 (CFG *)std::ostream::operator<<(in_stack_fffffffffffffd20,*(int *)(in_RDI + 0x34));
            in_stack_fffffffffffffd10 =
                 std::operator<<((ostream *)in_stack_fffffffffffffd18," and ");
            this_00 = (void *)std::ostream::operator<<
                                        (in_stack_fffffffffffffd10,
                                         *(int *)(in_RDI + 0x34) + *(int *)(in_RDI + 0x30));
            std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
          }
LAB_001ca369:
          local_1c8 = local_1c8 + 1;
        }
        local_1c4 = 0;
      }
      std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::~vector
                ((vector<covenant::Sym,_std::allocator<covenant::Sym>_> *)in_stack_fffffffffffffd10)
      ;
      local_1a4 = local_1a4 + 1;
    }
    local_1a0 = local_1a0 + 1;
  } while( true );
}

Assistant:

inline void check_well_formed()
    {
      bool error=false;
      ostringstream error_msg;
      if (prods.size() == 0)
      {
        error=true;
        error_msg << "ERROR: grammar must have at least one production rule." << endl;
      }
      for( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        if (prods[vv].size() == 0){
          error=true;
          error_msg << "ERROR: " 
                    << Sym::mkVar(vv) << " non-terminal symbol without rule.\n"; 
          error_msg << "Also possible a terminal misinterpreted as nonterminal.\n";
        }
      }
      for ( unsigned int vv = 0; (vv < prods.size() && !error); vv++ )
      {
        for ( unsigned int ri = 0; (ri < prods[vv].size() && !error); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 0) continue;
          for (unsigned k=0; ( k < RHS.size() && !error) ;k++)
          {
            if (RHS[k].isTerm () && 
                !(RHS[k].symID () >= alphstart && 
                  RHS[k].symID()  <  alphstart+alphsz)){
              error=true;
              error_msg << "ERROR: some terminal symbol is out of range. ";
              error_msg << "It must be between " << alphstart << " and " << alphstart+alphsz << endl;   
            }
          }
        }
      }
      if (error)
      {
        cout << *this << endl << error_msg.str();
        exit(1);
      }
    }